

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O2

void quest_talk(monst *mtmp)

{
  byte *pbVar1;
  uchar uVar2;
  boolean bVar3;
  byte bVar4;
  char *pcVar5;
  uint uVar6;
  int msgnum;
  
  if (mtmp->m_id == quest_status.leader_m_id) {
    if ((mtmp->field_0x62 & 0x40) == 0) {
      if ((quest_status._0_4_ & 0x20) == 0) {
        qt_pager(0x12);
      }
      quest_status._0_4_ = quest_status._0_4_ | 0x20;
      pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
      *pbVar1 = *pbVar1 & 0xcf;
    }
    bVar3 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
    if (bVar3 == '\0') {
      return;
    }
    if (((quest_status._0_4_ & 0x20) == 0) && (chat_with_leader(), (quest_status._0_4_ & 0x20) == 0)
       ) {
      return;
    }
    pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
    *pbVar1 = *pbVar1 & 0xcf;
    mtmp->field_0x62 = mtmp->field_0x62 & 0xbf;
    return;
  }
  uVar2 = mtmp->data->msound;
  if (uVar2 != '\x18') {
    if (uVar2 != ' ') {
      return;
    }
    if (quest_status._0_2_ < 0) {
      uVar6 = mt_random();
      if (uVar6 % 5 != 0) {
        return;
      }
      uVar6 = mt_random();
      qt_pager(uVar6 % 10 + 0x3c);
      return;
    }
    if ((u.uhave._0_1_ & 0x10) == 0) {
      uVar6 = (uint)quest_status._0_4_ >> 10 & 7;
      if (((uint)quest_status._0_4_ >> 0xd & 1) == 0 || uVar6 == 1) {
        msgnum = 0x32;
      }
      else if (uVar6 < 4) {
        msgnum = 0x33;
      }
      else if (uVar6 == 7) {
        uVar6 = mt_random();
        if (uVar6 % 5 != 0) goto LAB_0021bbe5;
        uVar6 = mt_random();
        msgnum = uVar6 % 10 + 0x3c;
      }
      else {
        msgnum = 0x34;
      }
    }
    else {
      msgnum = 0x35;
    }
    qt_pager(msgnum);
LAB_0021bbe5:
    uVar6 = quest_status._0_4_ & 0xffffc3ff | quest_status._0_4_ + 0x400 & 0x1c00;
    if ((~quest_status._0_4_ & 0x1c00) == 0) {
      uVar6 = quest_status._0_4_;
    }
    quest_status._0_4_ = uVar6 | 0x2000;
    return;
  }
  if (mtmp->data != mons + 0x11d) {
    return;
  }
  if ((mtmp->mstrategy & 0x30000000) == 0) {
    return;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021bc6b;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021bc62;
      }
      else {
LAB_0021bc62:
        if (ublindf == (obj *)0x0) goto LAB_0021bd61;
LAB_0021bc6b:
        if (ublindf->oartifact != '\x1d') goto LAB_0021bd61;
      }
      if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_0021bd61;
      bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x0021bcec;
    }
  }
  else {
    bVar4 = worm_known(level,mtmp);
joined_r0x0021bcec:
    if (bVar4 == 0) goto LAB_0021bd61;
  }
  uVar6 = *(uint *)&mtmp->field_0x60;
  if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar6 & 0x280) != 0) goto LAB_0021bd61;
  }
  else if (((uVar6 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_0021bd61;
  if ((u._1052_1_ & 0x20) == 0) {
    pcVar5 = Monnam(mtmp);
    pline("%s speaks:",pcVar5);
  }
LAB_0021bd61:
  verbalize("I\'m finally free!");
  pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
  *pbVar1 = *pbVar1 & 0xcf;
  mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
  adjalign(3);
  angry_guards('\0');
  return;
}

Assistant:

void quest_talk(struct monst *mtmp)
{
    if (mtmp->m_id == Qstat(leader_m_id)) {
	leader_speaks(mtmp);
	return;
    }
    switch(mtmp->data->msound) {
	    case MS_NEMESIS:	nemesis_speaks(); break;
	    case MS_DJINNI:	prisoner_speaks(mtmp); break;
	    default:		break;
	}
}